

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O3

void helper_crypto_sm4e_aarch64(void *vd,void *vn)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t *rn;
  uint uVar3;
  uint uVar4;
  undefined8 local_28;
  undefined8 uStack_20;
  CRYPTO_STATE n;
  
  local_28 = *vd;
  uStack_20 = *(undefined8 *)((long)vd + 8);
  n.l[0] = *vn;
  n.l[1] = *(uint64_t *)((long)vn + 8);
  uVar2 = 0;
  do {
    uVar1 = uVar2 + 1;
    uVar3 = *(uint *)((long)&local_28 + (uVar2 ^ 2) * 4) ^
            *(uint *)((long)&local_28 + (ulong)((uint)uVar1 & 3) * 4) ^
            *(uint *)((long)&local_28 + (ulong)((int)uVar2 - 1U & 3) * 4) ^
            *(uint *)((long)&n + uVar2 * 4);
    uVar4 = CONCAT13(sm4_sbox[uVar3 >> 0x18],
                     CONCAT12(sm4_sbox[uVar3 >> 0x10 & 0xff],
                              CONCAT11(sm4_sbox[uVar3 >> 8 & 0xff],sm4_sbox[uVar3 & 0xff])));
    *(uint *)((long)&local_28 + uVar2 * 4) =
         (uVar4 << 0x18 | uVar4 >> 8) ^
         (uVar4 << 0x12 | uVar4 >> 0xe) ^ (uVar4 << 2 | (uint)(sm4_sbox[uVar3 >> 0x18] >> 6)) ^
         uVar4 ^ (uVar4 << 10 | uVar4 >> 0x16) ^ *(uint *)((long)&local_28 + uVar2 * 4);
    uVar2 = uVar1;
  } while (uVar1 != 4);
  *(undefined8 *)vd = local_28;
  *(undefined8 *)((long)vd + 8) = uStack_20;
  return;
}

Assistant:

void HELPER(crypto_sm4e)(void *vd, void *vn)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    uint32_t t, i;

    for (i = 0; i < 4; i++) {
        t = CR_ST_WORD(d, (i + 1) % 4) ^
            CR_ST_WORD(d, (i + 2) % 4) ^
            CR_ST_WORD(d, (i + 3) % 4) ^
            CR_ST_WORD(n, i);

        t = sm4_sbox[t & 0xff] |
            sm4_sbox[(t >> 8) & 0xff] << 8 |
            sm4_sbox[(t >> 16) & 0xff] << 16 |
            sm4_sbox[(t >> 24) & 0xff] << 24;

        CR_ST_WORD(d, i) ^= t ^ rol32(t, 2) ^ rol32(t, 10) ^ rol32(t, 18) ^
                            rol32(t, 24);
    }

    rd[0] = d.l[0];
    rd[1] = d.l[1];
}